

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QConcatenateTablesProxyModelPrivate::ModelInfo>::relocate
          (QArrayDataPointer<QConcatenateTablesProxyModelPrivate::ModelInfo> *this,qsizetype offset,
          ModelInfo **data)

{
  bool bVar1;
  void *n;
  ModelInfo *in_RDX;
  long in_RSI;
  ModelInfo *in_RDI;
  ModelInfo *res;
  
  n = (void *)((long)(in_RDI->connections)._M_elems[0].d_ptr + in_RSI * 0x90);
  QtPrivate::q_relocate_overlap_n<QConcatenateTablesProxyModelPrivate::ModelInfo,long_long>
            (in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (ModelInfo *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QConcatenateTablesProxyModelPrivate::ModelInfo>,QConcatenateTablesProxyModelPrivate::ModelInfo_const*>
                        (data,(QArrayDataPointer<QConcatenateTablesProxyModelPrivate::ModelInfo> *)
                              res), bVar1)) {
    in_RDX->model = in_RDX->model + in_RSI * 9;
  }
  (in_RDI->connections)._M_elems[0].d_ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }